

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O1

void __thiscall
chaiscript::dispatch::
Proxy_Function_Callable_Impl<void_(int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ChaiScript[P]ChaiScript/unittests/compiled_tests.cpp:1034:28)>
::~Proxy_Function_Callable_Impl
          (Proxy_Function_Callable_Impl<void_(int_&),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ChaiScript[P]ChaiScript_unittests_compiled_tests_cpp:1034:28)>
           *this)

{
  void *pvVar1;
  
  *(undefined ***)this = &PTR__Proxy_Function_Base_005a4c18;
  pvVar1 = *(void **)&this->field_0x8;
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,*(long *)&this->field_0x18 - (long)pvVar1);
  }
  operator_delete(this,0x28);
  return;
}

Assistant:

explicit Proxy_Function_Callable_Impl(Callable f)
          : Proxy_Function_Impl_Base(detail::build_param_type_list(static_cast<Func *>(nullptr)))
          , m_f(std::move(f)) {
      }